

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMNode.hpp
# Opt level: O2

CMStateSet * __thiscall xercesc_4_0::CMNode::getFirstPos(CMNode *this)

{
  CMStateSet *pCVar1;
  
  pCVar1 = this->fFirstPos;
  if (pCVar1 == (CMStateSet *)0x0) {
    pCVar1 = (CMStateSet *)XMemory::operator_new(0x20,this->fMemoryManager);
    CMStateSet::CMStateSet(pCVar1,(ulong)this->fMaxStates,this->fMemoryManager);
    this->fFirstPos = pCVar1;
    (*this->_vptr_CMNode[3])(this,pCVar1);
    pCVar1 = this->fFirstPos;
  }
  return pCVar1;
}

Assistant:

inline const CMStateSet& CMNode::getFirstPos()
{
    //
    //  Fault in the state set if needed. Since we can't use mutable members
    //  cast off the const'ness.
    //
    if (!fFirstPos)
    {
        fFirstPos = new (fMemoryManager) CMStateSet(fMaxStates, fMemoryManager);
        calcFirstPos(*fFirstPos);
    }
    return *fFirstPos;
}